

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

any * __thiscall
Omega_h::InputYamlReader::seq_next_item
          (any *__return_storage_ptr__,InputYamlReader *this,any *items,any *next_item)

{
  bool bVar1;
  InputList *pIVar2;
  type_info *ptVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  InputScalar *this_00;
  InputMap *pIVar5;
  ParserFail *this_01;
  allocator local_151;
  string local_150 [32];
  undefined1 local_130 [8];
  shared_ptr<Omega_h::Input> sptr_2;
  InputMap value_2;
  shared_ptr<Omega_h::Input> sptr_1;
  InputList value_1;
  shared_ptr<Omega_h::Input> sptr;
  string local_78 [8];
  string value;
  undefined1 local_58 [8];
  InputList list;
  any *next_item_local;
  any *items_local;
  InputYamlReader *this_local;
  
  list.entries.
  super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)next_item;
  pIVar2 = any_cast<Omega_h::InputList&&>(items);
  InputList::InputList((InputList *)local_58,pIVar2);
  ptVar3 = any::type((any *)list.entries.
                            super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = std::type_info::operator==(ptVar3,(type_info *)&std::__cxx11::string::typeinfo);
  if (bVar1) {
    pbVar4 = any_cast<std::__cxx11::string&&>
                       ((any *)list.entries.
                               super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::string(local_78,(string *)pbVar4);
    this_00 = (InputScalar *)operator_new(0x38);
    InputScalar::InputScalar(this_00,(string *)local_78);
    std::shared_ptr<Omega_h::Input>::shared_ptr<Omega_h::InputScalar,void>
              ((shared_ptr<Omega_h::Input> *)
               &value_1.entries.
                super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this_00);
    InputList::add((InputList *)local_58,
                   (shared_ptr<Omega_h::Input> *)
                   &value_1.entries.
                    super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<Omega_h::Input>::~shared_ptr
              ((shared_ptr<Omega_h::Input> *)
               &value_1.entries.
                super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_78);
  }
  else {
    ptVar3 = any::type((any *)list.entries.
                              super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputList::typeinfo);
    if (bVar1) {
      pIVar2 = any_cast<Omega_h::InputList&&>
                         ((any *)list.entries.
                                 super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      InputList::InputList
                ((InputList *)
                 &sptr_1.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 pIVar2);
      pIVar2 = (InputList *)operator_new(0x30);
      InputList::InputList
                (pIVar2,(InputList *)
                        &sptr_1.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount);
      std::shared_ptr<Omega_h::Input>::shared_ptr<Omega_h::InputList,void>
                ((shared_ptr<Omega_h::Input> *)
                 &value_2.map._M_t._M_impl.super__Rb_tree_header._M_node_count,pIVar2);
      InputList::add((InputList *)local_58,
                     (shared_ptr<Omega_h::Input> *)
                     &value_2.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::shared_ptr<Omega_h::Input>::~shared_ptr
                ((shared_ptr<Omega_h::Input> *)
                 &value_2.map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      InputList::~InputList
                ((InputList *)
                 &sptr_1.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
    }
    else {
      ptVar3 = any::type((any *)list.entries.
                                super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = std::type_info::operator==(ptVar3,(type_info *)&InputMap::typeinfo);
      if (!bVar1) {
        this_01 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_150,"bug in InputYamlReader: unexpected type for sequence item",&local_151)
        ;
        ParserFail::ParserFail(this_01,(string *)local_150);
        __cxa_throw(this_01,&ParserFail::typeinfo,ParserFail::~ParserFail);
      }
      pIVar5 = any_cast<Omega_h::InputMap&&>
                         ((any *)list.entries.
                                 super__Vector_base<std::shared_ptr<Omega_h::Input>,_std::allocator<std::shared_ptr<Omega_h::Input>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      InputMap::InputMap((InputMap *)
                         &sptr_2.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,pIVar5);
      pIVar5 = (InputMap *)operator_new(0x48);
      InputMap::InputMap(pIVar5,(InputMap *)
                                &sptr_2.
                                 super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
      std::shared_ptr<Omega_h::Input>::shared_ptr<Omega_h::InputMap,void>
                ((shared_ptr<Omega_h::Input> *)local_130,pIVar5);
      InputList::add((InputList *)local_58,(shared_ptr<Omega_h::Input> *)local_130);
      std::shared_ptr<Omega_h::Input>::~shared_ptr((shared_ptr<Omega_h::Input> *)local_130);
      InputMap::~InputMap((InputMap *)
                          &sptr_2.super___shared_ptr<Omega_h::Input,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    }
  }
  any::any<Omega_h::InputList,void>(__return_storage_ptr__,(InputList *)local_58);
  InputList::~InputList((InputList *)local_58);
  return __return_storage_ptr__;
}

Assistant:

any seq_next_item(any& items, any& next_item) {
    auto list = any_cast<InputList&&>(std::move(items));
    if (next_item.type() == typeid(std::string)) {
      std::string value = any_cast<std::string&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputScalar(std::move(value)));
      list.add(std::move(sptr));
    } else if (next_item.type() == typeid(InputList)) {
      InputList value = any_cast<InputList&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputList(std::move(value)));
      list.add(std::move(sptr));
    } else if (next_item.type() == typeid(InputMap)) {
      InputMap value = any_cast<InputMap&&>(std::move(next_item));
      std::shared_ptr<Input> sptr(new InputMap(std::move(value)));
      list.add(std::move(sptr));
    } else {
      throw ParserFail(
          "bug in InputYamlReader: unexpected type for sequence item");
    }
    return any(std::move(list));
  }